

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
::moveFromSpan(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
               *this,Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
                     *fromSpan,size_t fromIndex,size_t to)

{
  uchar *puVar1;
  Entry *pEVar2;
  undefined8 *puVar3;
  byte bVar4;
  long lVar5;
  code *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  
  if (this[0x89] == this[0x88]) {
    addStorage(this);
  }
  this[to] = this[0x89];
  lVar5 = *(long *)(this + 0x80);
  uVar8 = (ulong)(byte)this[0x89];
  this[0x89] = *(Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(void_*,_void_*)>_>_>
                 *)(lVar5 + uVar8 * 0x28);
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar2 = fromSpan->entries + bVar4;
  *(undefined8 *)(lVar5 + uVar8 * 0x28) = *(undefined8 *)(pEVar2->storage).data;
  puVar3 = (undefined8 *)(lVar5 + 8 + uVar8 * 0x28);
  *puVar3 = 0;
  puVar3[1] = 0;
  *(undefined8 *)(lVar5 + 0x18 + uVar8 * 0x28) = 0;
  *(undefined8 *)(lVar5 + 0x20 + uVar8 * 0x28) = *(undefined8 *)((pEVar2->storage).data + 0x20);
  if (*(long *)((pEVar2->storage).data + 0x18) != 0) {
    lVar5 = lVar5 + uVar8 * 0x28;
    uVar7 = *(undefined8 *)((pEVar2->storage).data + 0x10);
    *(undefined8 *)(lVar5 + 8) = *(undefined8 *)((pEVar2->storage).data + 8);
    *(undefined8 *)(lVar5 + 0x10) = uVar7;
    *(undefined8 *)(lVar5 + 0x18) = *(undefined8 *)((pEVar2->storage).data + 0x18);
    (pEVar2->storage).data[0x18] = '\0';
    (pEVar2->storage).data[0x19] = '\0';
    (pEVar2->storage).data[0x1a] = '\0';
    (pEVar2->storage).data[0x1b] = '\0';
    (pEVar2->storage).data[0x1c] = '\0';
    (pEVar2->storage).data[0x1d] = '\0';
    (pEVar2->storage).data[0x1e] = '\0';
    (pEVar2->storage).data[0x1f] = '\0';
    (pEVar2->storage).data[0x20] = '\0';
    (pEVar2->storage).data[0x21] = '\0';
    (pEVar2->storage).data[0x22] = '\0';
    (pEVar2->storage).data[0x23] = '\0';
    (pEVar2->storage).data[0x24] = '\0';
    (pEVar2->storage).data[0x25] = '\0';
    (pEVar2->storage).data[0x26] = '\0';
    (pEVar2->storage).data[0x27] = '\0';
  }
  pcVar6 = *(code **)((pEVar2->storage).data + 0x18);
  if (pcVar6 != (code *)0x0) {
    puVar1 = (pEVar2->storage).data + 8;
    (*pcVar6)(puVar1,puVar1,3);
  }
  (pEVar2->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }